

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *__s;
  char *pcVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *p_00;
  size_t sVar8;
  char cVar9;
  uint uVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  
  __s = Extra_FileReadContents(pFileName);
  if (__s == (char *)0x0) {
    printf("Cannot open input file %s\n",pFileName);
  }
  cVar9 = *__s;
  if (cVar9 == '\0') {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    pcVar6 = __s;
    do {
      pcVar6 = pcVar6 + 1;
      uVar12 = uVar12 + (cVar9 == '\n');
      cVar9 = *pcVar6;
    } while (cVar9 != '\0');
  }
  p = (Vec_Int_t *)malloc(0x10);
  uVar10 = uVar12;
  if (uVar12 - 1 < 0xf) {
    uVar10 = 0x10;
  }
  p->nSize = 0;
  p->nCap = uVar10;
  if (uVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((ulong)uVar10 << 2);
  }
  p->pArray = piVar7;
  uVar10 = uVar12 * 10;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (uVar12 * 10 - 1 < 0xf) {
    uVar10 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar10;
  if (uVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((ulong)uVar10 << 2);
  }
  p_00->pArray = piVar7;
  pcVar6 = strtok(__s," w(-,)]\r\t");
  pcVar11 = extraout_RDX;
  do {
    if (pcVar6 == (char *)0x0) {
      if (__s != (char *)0x0) {
        free(__s);
        pcVar11 = extraout_RDX_01;
      }
      Gia_ManBuildGig(p,p_00,pcVar11);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      return (Gia_Man_t *)0x0;
    }
    Vec_IntPush(p,p_00->nSize);
    if (9 < (byte)(*pcVar6 - 0x30U)) {
      __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xe6,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    iVar4 = atoi(pcVar6);
    Vec_IntPush(p_00,iVar4);
    pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
    if (*pcVar6 != '=') {
      __assert_fail("pToken[0] == \'=\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                    ,0xea,"Gia_Man_t *Gia_ManReadGig(char *)");
    }
    pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
    sVar8 = strlen(pcVar6);
    cVar9 = pcVar6[sVar8 - 1];
    if (cVar9 == '\n') {
      pcVar6[sVar8 - 1] = '\0';
    }
    lVar13 = 1;
    while (iVar4 = strcmp(pcVar6,s_GigNames[lVar13]), iVar4 != 0) {
      lVar13 = lVar13 + 1;
      if (lVar13 == 10) {
        __assert_fail("Type < GIG_UNUSED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0xf6,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
    }
    iVar4 = (int)lVar13;
    Vec_IntPush(p_00,iVar4);
    if (cVar9 != '\n') {
      uVar12 = p_00->nSize;
      Vec_IntPush(p_00,0);
      pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
      while( true ) {
        if (pcVar6 == (char *)0x0) {
          __assert_fail("pToken != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x106,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        cVar9 = *pcVar6;
        if (cVar9 == '\n') goto LAB_006afc4b;
        if (cVar9 == '[') break;
        if (9 < (byte)(cVar9 - 0x30U)) {
          __assert_fail("pToken[0] >= \'0\' && pToken[0] <= \'9\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x102,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        iVar5 = atoi(pcVar6);
        Vec_IntPush(p_00,iVar5);
        if (((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[uVar12] = p_00->pArray[uVar12] + 1;
        pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
      }
      pcVar11 = pcVar6 + 1;
      if (iVar4 == 6) {
        iVar4 = atoi(pcVar11);
      }
      else {
        if (iVar4 != 5) {
          __assert_fail("Type == GIG_DELAY",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x117,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        sVar8 = strlen(pcVar11);
        if (sVar8 != 4) {
          __assert_fail("strlen(pToken) == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                        ,0x10e,"Gia_Man_t *Gia_ManReadGig(char *)");
        }
        cVar9 = *pcVar11;
        iVar4 = -0x30;
        iVar5 = -0x30;
        if (((9 < (byte)(cVar9 - 0x30U)) && (iVar5 = -0x37, 5 < (byte)(cVar9 + 0xbfU))) &&
           (iVar5 = -0x57, 5 < (byte)(cVar9 + 0x9fU))) {
LAB_006afde4:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x343,"int Abc_TtReadHexDigit(char)");
        }
        cVar1 = pcVar6[2];
        if (((9 < (byte)(cVar1 - 0x30U)) && (iVar4 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
           (iVar4 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) goto LAB_006afde4;
        cVar2 = pcVar6[3];
        iVar14 = -0x30;
        iVar15 = -0x30;
        if (((9 < (byte)(cVar2 - 0x30U)) && (iVar15 = -0x37, 5 < (byte)(cVar2 + 0xbfU))) &&
           (iVar15 = -0x57, 5 < (byte)(cVar2 + 0x9fU))) goto LAB_006afde4;
        cVar3 = pcVar6[4];
        if (((9 < (byte)(cVar3 - 0x30U)) && (iVar14 = -0x37, 5 < (byte)(cVar3 + 0xbfU))) &&
           (iVar14 = -0x57, 5 < (byte)(cVar3 + 0x9fU))) goto LAB_006afde4;
        iVar4 = (iVar14 + cVar3) * 0x1000 +
                (iVar15 + cVar2) * 0x100 + (iVar4 + cVar1) * 0x10 + iVar5 + cVar9;
      }
      Vec_IntPush(p_00,iVar4);
      pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
      if (*pcVar6 != '\n') {
        __assert_fail("pToken[0] == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x11c,"Gia_Man_t *Gia_ManReadGig(char *)");
      }
    }
LAB_006afc4b:
    pcVar6 = strtok((char *)0x0," w(-,)]\r\t");
    pcVar11 = extraout_RDX_00;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    Gia_Man_t * pNew;
    int Type, Offset, fEndOfLine, Digit, nObjs; 
    char * pChars  = " w(-,)]\r\t";
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pStart  = pBuffer, * pToken;
    Vec_Int_t * vObjs, * vStore;
    if ( pBuffer == NULL )
        printf( "Cannot open input file %s\n", pFileName );
    // count objects
    for ( nObjs = 0, pToken = pBuffer; *pToken; pToken++ )
        nObjs += (int)(*pToken == '\n');
    // read objects
    vObjs  = Vec_IntAlloc( nObjs );
    vStore = Vec_IntAlloc( 10*nObjs );
    while ( 1 )
    {
        // read net ID
        pToken = strtok( pStart, pChars );
        pStart = NULL;
        if ( pToken == NULL )
            break;
        // start new object
        Vec_IntPush( vObjs, Vec_IntSize(vStore) );
        // save net ID
        assert( pToken[0] >= '0' && pToken[0] <= '9' );
        Vec_IntPush( vStore, atoi(pToken) );
        // read equal
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '=' );
        // read type
        pToken = strtok( pStart, pChars );
        fEndOfLine = 0;
        if ( pToken[strlen(pToken)-1] == '\n' )
        {
            pToken[strlen(pToken)-1] = 0;
            fEndOfLine = 1;
        }
        for ( Type = GIG_RESET; Type < GIG_UNUSED; Type++ )
            if ( !strcmp(pToken, s_GigNames[Type]) )
                break;
        assert( Type < GIG_UNUSED );
        Vec_IntPush( vStore, Type );
        if ( fEndOfLine )
            continue;
        // read fanins
        Offset = Vec_IntSize(vStore);
        Vec_IntPush( vStore, 0 );
        while ( 1 )
        {
            pToken = strtok( pStart, pChars );
            if ( pToken == NULL || pToken[0] == '\n' || pToken[0] == '[' )
                break;
            assert( pToken[0] >= '0' && pToken[0] <= '9' );
            Vec_IntPush( vStore, atoi(pToken) );
            Vec_IntAddToEntry( vStore, Offset, 1 );
        }
        assert( pToken != NULL );
        if ( pToken[0] == '\n' )
            continue;
        assert( pToken[0] == '[' );
        // read attribute
        pToken++;
        if ( Type == GIG_LUT )
        {
            assert( strlen(pToken) == 4 );
            Digit  = Abc_TtReadHexDigit(pToken[0]);
            Digit |= Abc_TtReadHexDigit(pToken[1]) << 4;
            Digit |= Abc_TtReadHexDigit(pToken[2]) << 8;
            Digit |= Abc_TtReadHexDigit(pToken[3]) << 12;
            Vec_IntPush( vStore, Digit );
        }
        else
        {
            assert( Type == GIG_DELAY );
            Vec_IntPush( vStore, atoi(pToken) );
        }
        // read end of line
        pToken = strtok( pStart, pChars );
        assert( pToken[0] == '\n' );
    }
    ABC_FREE( pBuffer );
    // create AIG
    pNew = Gia_ManBuildGig( vObjs, vStore, pFileName );
    // cleanup
    Vec_IntFree( vObjs );
    Vec_IntFree( vStore );
    return pNew;
}